

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O1

void __thiscall AutoFile::seek(AutoFile *this,int64_t offset,int origin)

{
  long lVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::seek: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00e0ef94;
  }
  iVar2 = fseek((FILE *)this->m_file,offset,origin);
  if (iVar2 != 0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    iVar2 = feof((FILE *)this->m_file);
    pcVar5 = "AutoFile::seek: end of file";
    if (iVar2 == 0) {
      pcVar5 = "AutoFile::seek: fseek failed";
    }
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)pcVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00e0ef94;
  }
  if (origin == 1) {
    if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged != true) goto LAB_00e0eded;
    (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value =
         (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload._M_value + offset;
  }
  else {
    if (origin == 0) {
      (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = offset;
    }
    else {
LAB_00e0eded:
      lVar3 = ftell((FILE *)this->m_file);
      if (lVar3 < 0) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::seek: ftell failed");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_00e0ef94;
      }
      (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = lVar3;
    }
    (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00e0ef94:
  __stack_chk_fail();
}

Assistant:

void AutoFile::seek(int64_t offset, int origin)
{
    if (IsNull()) {
        throw std::ios_base::failure("AutoFile::seek: file handle is nullptr");
    }
    if (std::fseek(m_file, offset, origin) != 0) {
        throw std::ios_base::failure(feof() ? "AutoFile::seek: end of file" : "AutoFile::seek: fseek failed");
    }
    if (origin == SEEK_SET) {
        m_position = offset;
    } else if (origin == SEEK_CUR && m_position.has_value()) {
        *m_position += offset;
    } else {
        int64_t r{std::ftell(m_file)};
        if (r < 0) {
            throw std::ios_base::failure("AutoFile::seek: ftell failed");
        }
        m_position = r;
    }
}